

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

arg_type_mismatch * __thiscall
boost::runtime::specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error>
::operator<<(specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error>
             *this,char *val)

{
  long in_RSI;
  arg_type_mismatch *in_RDI;
  arg_type_mismatch *in_stack_ffffffffffffffc8;
  arg_type_mismatch *this_00;
  
  this_00 = in_RDI;
  std::__cxx11::string::append((char *)(in_RSI + 0x18));
  arg_type_mismatch::arg_type_mismatch(this_00,in_stack_ffffffffffffffc8);
  return in_RDI;
}

Assistant:

Derived operator<<(char const* val) &&
    {
        this->msg.append( val );

        return reinterpret_cast<Derived&&>(*this);
    }